

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O0

void __thiscall memory::memory(memory *this,longlong cap)

{
  uchar *puVar1;
  int local_1c;
  int i;
  longlong cap_local;
  memory *this_local;
  
  this->PC = 0;
  this->count = 0;
  this->capacity = cap;
  puVar1 = (uchar *)operator_new__(cap);
  this->mem = puVar1;
  this->jump_flag = false;
  for (local_1c = 0; (long)local_1c < this->capacity; local_1c = local_1c + 1) {
    this->mem[local_1c] = '\0';
  }
  return;
}

Assistant:

memory::memory(long long cap) {
   PC=0;
   count=0;
   capacity=cap;
   mem=new unsigned char[cap];
   jump_flag=false;
   for(int i=0;i<capacity;++i){
       mem[i]=0;
   }
}